

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O0

ModelPtr createModelTwoComponentsWithOneVariableEach
                   (string *modelName,string *c1Name,string *c2Name,string *v1Name,string *v2Name)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ModelPtr MVar4;
  allocator<char> local_d9;
  string local_d8 [32];
  undefined1 local_b8 [8];
  VariablePtr v2;
  string local_a0 [32];
  undefined1 local_80 [8];
  VariablePtr v1;
  ComponentPtr c2;
  ComponentPtr c1;
  string *v2Name_local;
  string *v1Name_local;
  string *c2Name_local;
  string *c1Name_local;
  string *modelName_local;
  ModelPtr *model;
  
  libcellml::Model::create();
  peVar1 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)modelName);
  libcellml::NamedEntity::setName((string *)peVar1);
  createComponentInModel
            ((ModelPtr *)
             &c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             modelName);
  createComponentInModel
            ((ModelPtr *)
             &v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             modelName);
  libcellml::Variable::create();
  peVar2 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_80);
  libcellml::NamedEntity::setName((string *)peVar2);
  peVar2 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a0,"public",
             (allocator<char> *)
             ((long)&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Variable::setInterfaceType((string *)peVar2);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar3);
  libcellml::Variable::create();
  peVar2 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_b8);
  libcellml::NamedEntity::setName((string *)peVar2);
  peVar2 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"public",&local_d9);
  libcellml::Variable::setInterfaceType((string *)peVar2);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar3);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_b8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_80);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  MVar4.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar4.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)modelName;
  return (ModelPtr)MVar4.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

libcellml::ModelPtr createModelTwoComponentsWithOneVariableEach(const std::string &modelName, const std::string &c1Name, const std::string &c2Name, const std::string &v1Name, const std::string &v2Name)
{
    libcellml::ModelPtr model = libcellml::Model::create();
    model->setName(modelName);
    auto c1 = createComponentInModel(model, c1Name);
    auto c2 = createComponentInModel(model, c2Name);

    libcellml::VariablePtr v1 = libcellml::Variable::create();
    v1->setName(v1Name);
    v1->setInterfaceType("public");
    c1->addVariable(v1);
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    v2->setName(v2Name);
    v2->setInterfaceType("public");
    c2->addVariable(v2);

    return model;
}